

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.cpp
# Opt level: O2

void __thiscall antlr::RecognitionException::RecognitionException(RecognitionException *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"parsing error",&local_31);
  ANTLRException::ANTLRException(&this->super_ANTLRException,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_ANTLRException)._vptr_ANTLRException =
       (_func_int **)&PTR__RecognitionException_002c20f0;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  this->line = -1;
  this->column = -1;
  return;
}

Assistant:

RecognitionException::RecognitionException()
: ANTLRException("parsing error")
, line(-1)
, column(-1)
{
}